

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void pulse_prog_glass(CHAR_DATA *mob)

{
  CHAR_DATA *ch;
  bool bVar1;
  int iVar2;
  CHAR_DATA *in_RDI;
  AFFECT_DATA caf;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  undefined1 in_stack_00001262;
  undefined1 in_stack_00001263;
  int in_stack_00001264;
  int in_stack_00001268;
  int in_stack_0000126c;
  CHAR_DATA *in_stack_00001270;
  CHAR_DATA *in_stack_00001278;
  int in_stack_00001298;
  int in_stack_000012a0;
  char *in_stack_000012a8;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 uVar3;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  AFFECT_DATA *in_stack_ffffffffffffff08;
  
  ch = in_RDI->fighting;
  if ((ch != (CHAR_DATA *)0x0) && (ch->in_room == in_RDI->in_room)) {
    iVar2 = number_percent();
    if (0x5a < iVar2) {
      bVar1 = is_affected(in_RDI,(int)gsn_trophy);
      if (!bVar1) {
        bVar1 = is_affected(ch,(int)gsn_impale);
        if (!bVar1) {
          act(in_stack_ffffffffffffff00,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
              (void *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
              (void *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
          act(in_stack_ffffffffffffff00,
              (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
              (void *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
              (void *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
          dice(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
          uVar3 = 0;
          uVar4 = 0;
          damage_new(in_stack_00001278,in_stack_00001270,in_stack_0000126c,in_stack_00001268,
                     in_stack_00001264,(bool)in_stack_00001263,(bool)in_stack_00001262,
                     in_stack_00001298,in_stack_000012a0,in_stack_000012a8);
          init_affect((AFFECT_DATA *)0x6866ab);
          new_affect_to_char(in_RDI,in_stack_ffffffffffffff08);
          affect_to_char((CHAR_DATA *)CONCAT44(in_stack_fffffffffffffef4,uVar4),
                         (AFFECT_DATA *)CONCAT44(in_stack_fffffffffffffeec,uVar3));
          init_affect((AFFECT_DATA *)0x686793);
          new_affect_to_char(in_RDI,in_stack_ffffffffffffff08);
        }
      }
    }
  }
  return;
}

Assistant:

void pulse_prog_glass(CHAR_DATA *mob)
{
	CHAR_DATA *victim = mob->fighting;
	AFFECT_DATA af, caf;

	if (victim
		&& victim->in_room == mob->in_room
		&& number_percent() > 90
		&& !is_affected(mob, gsn_trophy)
		&& !is_affected(victim, gsn_impale))
	{
		act("$n raises one of its massive arms and impales $N on it!", mob, 0, victim, TO_NOTVICT);
		act("$n raises one of its massive arms and impales you on it!", mob, 0, victim, TO_VICT);

		damage_new(mob, victim, dice(16, 15), TYPE_UNDEFINED, DAM_PIERCE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "impalement");

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.location = APPLY_STR;
		af.modifier = -mob->level / 7;
		af.duration = mob->level / 4;
		af.type = gsn_bleeding;
		af.aftype = AFT_MALADY;
		af.level = mob->level;
		af.owner = mob->leader;
		af.end_fun = nullptr;
		new_affect_to_char(victim, &af);

		af.location = APPLY_DEX;
		affect_to_char(victim, &af);

		init_affect(&caf);
		caf.where = TO_AFFECTS;
		caf.location = 0;
		caf.modifier = 0;
		caf.duration = 1;
		caf.type = gsn_trophy;
		caf.level = mob->level;
		caf.aftype = AFT_SKILL;
		caf.owner = mob->leader;
		caf.end_fun = nullptr;
		new_affect_to_char(mob, &caf);
	}
}